

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  int *piVar2;
  ImVec4 *pIVar3;
  ImGuiColorMod *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImGuiContext *pIVar11;
  int iVar12;
  ImGuiColorMod *__dest;
  int iVar13;
  int iVar14;
  ImVec4 IVar15;
  
  pIVar11 = GImGui;
  pIVar3 = (GImGui->Style).Colors + idx;
  fVar7 = pIVar3->x;
  fVar8 = pIVar3->y;
  fVar9 = pIVar3->z;
  fVar10 = pIVar3->w;
  iVar12 = (GImGui->ColorStack).Size;
  if (iVar12 == (GImGui->ColorStack).Capacity) {
    if (iVar12 == 0) {
      iVar13 = 8;
    }
    else {
      iVar13 = iVar12 / 2 + iVar12;
    }
    iVar14 = iVar12 + 1;
    if (iVar12 + 1 < iVar13) {
      iVar14 = iVar13;
    }
    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar2 = *piVar2 + 1;
    __dest = (ImGuiColorMod *)(*GImAllocatorAllocFunc)((long)iVar14 * 0x14,GImAllocatorUserData);
    pIVar4 = (pIVar11->ColorStack).Data;
    if (pIVar4 != (ImGuiColorMod *)0x0) {
      memcpy(__dest,pIVar4,(long)(pIVar11->ColorStack).Size * 0x14);
      pIVar4 = (pIVar11->ColorStack).Data;
      if ((pIVar4 != (ImGuiColorMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
    }
    (pIVar11->ColorStack).Data = __dest;
    (pIVar11->ColorStack).Capacity = iVar14;
    iVar12 = (pIVar11->ColorStack).Size;
  }
  else {
    __dest = (GImGui->ColorStack).Data;
  }
  __dest[iVar12].Col = idx;
  pIVar1 = &__dest[iVar12].BackupValue;
  pIVar1->x = fVar7;
  pIVar1->y = fVar8;
  pIVar1->z = fVar9;
  pIVar1->w = fVar10;
  (pIVar11->ColorStack).Size = (pIVar11->ColorStack).Size + 1;
  auVar6 = vpinsrd_avx(ZEXT416(col),col >> 8,1);
  auVar5 = vpand_avx(auVar6,_DAT_00543210);
  auVar6 = vpinsrd_avx(ZEXT416(col >> 0x10 & 0xff),col >> 0x18,1);
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vmovlhps_avx(auVar5,auVar6);
  auVar5._8_4_ = 0x3b808081;
  auVar5._0_8_ = 0x3b8080813b808081;
  auVar5._12_4_ = 0x3b808081;
  IVar15 = (ImVec4)vmulps_avx512vl(auVar6,auVar5);
  *pIVar3 = IVar15;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}